

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

int __thiscall
SslUdpSocketImpl::DatenDecode
          (SslUdpSocketImpl *this,uint8_t *buffer,size_t nAnzahl,string *strAddress)

{
  BaseSocket *pBVar1;
  __array __n;
  bool bVar2;
  int iVar3;
  pointer pSVar4;
  size_t sVar5;
  type puVar6;
  type pSVar7;
  SSL *pSVar8;
  wchar_t *pwVar9;
  char *pOut;
  type __result;
  UdpSocket *local_318;
  UdpSocket *local_300;
  wstring local_288;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_268;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_248;
  __int_type local_228;
  size_t anz;
  __array temp_1;
  size_t nOutDataSize_1;
  unique_lock<std::mutex> lock1_1;
  bool bNewData_1;
  __array tmp;
  size_t len_1;
  int iErrorHint;
  __array Buffer;
  undefined1 local_1d0 [4];
  int iReturn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  wstring local_190;
  wstring local_170;
  wstring local_150;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_130;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_110;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_f0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_d0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_b0;
  uint local_8c;
  size_t sStack_88;
  int iError;
  size_t len;
  __array temp;
  size_t nOutDataSize;
  unique_lock<std::mutex> lock1;
  bool bNewData;
  int iSslInit;
  size_t nPut;
  unique_lock<std::mutex> lock;
  string *strAddress_local;
  size_t nAnzahl_local;
  uint8_t *buffer_local;
  SslUdpSocketImpl *this_local;
  
  if ((buffer == (uint8_t *)0x0) || (nAnzahl == 0)) {
    return 0;
  }
  lock._8_8_ = strAddress;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&nPut,&this->m_mxEnDecode);
  pSVar4 = std::
           unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ::operator->(&this->m_pSslCon);
  sVar5 = OpenSSLWrapper::SslConnection::SslPutInData(pSVar4,buffer,nAnzahl);
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&nPut);
  if ((this->m_bCloseReq & 1U) == 1) {
    this_local._4_4_ = -1;
    goto LAB_0011dfe4;
  }
  pSVar4 = std::
           unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ::operator->(&this->m_pSslCon);
  iVar3 = OpenSSLWrapper::SslConnection::SSLGetShutdown(pSVar4);
  if (1 < iVar3) {
    pSVar4 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    OpenSSLWrapper::SslConnection::ShutDownConnection(pSVar4,(int *)0x0);
    (*(this->super_UdpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl[2])();
    this_local._4_4_ = -1;
    goto LAB_0011dfe4;
  }
  pSVar4 = std::
           unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ::operator->(&this->m_pSslCon);
  lock1._12_4_ = OpenSSLWrapper::SslConnection::SslInitFinished(pSVar4);
  if (lock1._12_4_ == 0) {
    pSVar4 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    lock1._12_4_ = OpenSSLWrapper::SslConnection::SSLDoHandshake(pSVar4);
    lock1._11_1_ = 0;
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)&nOutDataSize,&this->m_mxEnDecode);
    pSVar4 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    temp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         OpenSSLWrapper::SslConnection::SslGetOutDataSize(pSVar4);
    while ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
           temp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
           _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0) {
      std::make_unique<unsigned_char[]>((size_t)&len);
      pSVar4 = std::
               unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ::operator->(&this->m_pSslCon);
      puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&len
                          ,0);
      sStack_88 = OpenSSLWrapper::SslConnection::SslGetOutData
                            (pSVar4,puVar6,
                             (size_t)temp._M_t.
                                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                     .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      if (sStack_88 != 0) {
        std::mutex::lock(&(this->super_UdpSocketImpl).m_mxOutDeque);
        std::__atomic_base<unsigned_long>::operator+=
                  (&(this->super_UdpSocketImpl).m_atOutBytes.super___atomic_base<unsigned_long>,
                   sStack_88);
        std::
        deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
        ::
        emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long_const&,std::__cxx11::string_const&>
                  ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                    *)&(this->super_UdpSocketImpl).m_quOutData,
                   (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&len,
                   &stack0xffffffffffffff78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lock._8_8_);
        std::mutex::unlock(&(this->super_UdpSocketImpl).m_mxOutDeque);
        lock1._11_1_ = 1;
      }
      pSVar4 = std::
               unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ::operator->(&this->m_pSslCon);
      temp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           OpenSSLWrapper::SslConnection::SslGetOutDataSize(pSVar4);
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&len);
    }
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&nOutDataSize);
    if ((lock1._11_1_ & 1) == 1) {
      UdpSocketImpl::TriggerWriteThread(&this->super_UdpSocketImpl);
    }
    if ((int)lock1._12_4_ < 1) {
      pSVar4 = std::
               unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ::operator->(&this->m_pSslCon);
      local_8c = OpenSSLWrapper::SslConnection::SSLGetError(pSVar4,lock1._12_4_);
      if (local_8c == 2) goto LAB_0011d9e2;
      (this->super_UdpSocketImpl).super_BaseSocketImpl.m_iError = local_8c | 0x80000000;
      (this->super_UdpSocketImpl).super_BaseSocketImpl.m_iErrLoc = 0xe;
      std::__cxx11::to_wstring(&local_150,local_8c);
      std::operator+(&local_130,L"SSL_error: ",&local_150);
      std::operator+(&local_110,&local_130,L", after SSL_do_handshake returned: ");
      std::__cxx11::to_wstring(&local_170,lock1._12_4_);
      std::operator+(&local_f0,&local_110,&local_170);
      std::operator+(&local_d0,&local_f0,L" on ssl context: ");
      pSVar7 = std::
               unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ::operator*(&this->m_pSslCon);
      pSVar8 = OpenSSLWrapper::SslConnection::operator()(pSVar7);
      std::__cxx11::to_wstring(&local_190,(unsigned_long)pSVar8);
      std::operator+(&local_b0,&local_d0,&local_190);
      pwVar9 = (wchar_t *)std::__cxx11::wstring::c_str();
      OutputDebugString(pwVar9);
      std::__cxx11::wstring::~wstring((wstring *)&local_b0);
      std::__cxx11::wstring::~wstring((wstring *)&local_190);
      std::__cxx11::wstring::~wstring((wstring *)&local_d0);
      std::__cxx11::wstring::~wstring((wstring *)&local_f0);
      std::__cxx11::wstring::~wstring((wstring *)&local_170);
      std::__cxx11::wstring::~wstring((wstring *)&local_110);
      std::__cxx11::wstring::~wstring((wstring *)&local_130);
      std::__cxx11::wstring::~wstring((wstring *)&local_150);
      pSVar4 = std::
               unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ::operator->(&this->m_pSslCon);
      OpenSSLWrapper::SslConnection::GetSslErrAsString_abi_cxx11_((string *)local_1d0,pSVar4);
      std::operator+(&local_1b0,", msg: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0)
      ;
      pOut = (char *)std::__cxx11::string::c_str();
      OutputDebugStringA(pOut);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)local_1d0);
      bVar2 = std::function::operator_cast_to_bool
                        ((function *)&(this->super_UdpSocketImpl).super_BaseSocketImpl.m_fErrorParam
                        );
      if ((bVar2) && (((this->super_UdpSocketImpl).super_BaseSocketImpl.m_bStop & 1U) == 0)) {
        std::function<void_(BaseSocket_*,_void_*)>::operator()
                  (&(this->super_UdpSocketImpl).super_BaseSocketImpl.m_fErrorParam,
                   (this->super_UdpSocketImpl).super_BaseSocketImpl.m_pBkRef,
                   (this->super_UdpSocketImpl).super_BaseSocketImpl.m_pvUserData);
      }
      else {
        bVar2 = std::function::operator_cast_to_bool
                          ((function *)&(this->super_UdpSocketImpl).super_BaseSocketImpl.m_fError);
        if ((bVar2) && (((this->super_UdpSocketImpl).super_BaseSocketImpl.m_bStop & 1U) == 0)) {
          std::function<void_(BaseSocket_*)>::operator()
                    (&(this->super_UdpSocketImpl).super_BaseSocketImpl.m_fError,
                     (this->super_UdpSocketImpl).super_BaseSocketImpl.m_pBkRef);
        }
      }
      this_local._4_4_ = -1;
      bVar2 = true;
    }
    else {
      bVar2 = std::operator!=(&this->m_fSllInitDoneParam,(nullptr_t)0x0);
      if (bVar2) {
        pBVar1 = (this->super_UdpSocketImpl).super_BaseSocketImpl.m_pBkRef;
        if (pBVar1 == (BaseSocket *)0x0) {
          local_300 = (UdpSocket *)0x0;
        }
        else {
          local_300 = (UdpSocket *)
                      __dynamic_cast(pBVar1,&BaseSocket::typeinfo,&UdpSocket::typeinfo,0);
        }
        std::function<void_(UdpSocket_*,_void_*)>::operator()
                  (&this->m_fSllInitDoneParam,local_300,
                   (this->super_UdpSocketImpl).super_BaseSocketImpl.m_pvUserData);
      }
      else {
        bVar2 = std::operator!=(&this->m_fSllInitDone,(nullptr_t)0x0);
        if (bVar2) {
          pBVar1 = (this->super_UdpSocketImpl).super_BaseSocketImpl.m_pBkRef;
          if (pBVar1 == (BaseSocket *)0x0) {
            local_318 = (UdpSocket *)0x0;
          }
          else {
            local_318 = (UdpSocket *)
                        __dynamic_cast(pBVar1,&BaseSocket::typeinfo,&UdpSocket::typeinfo,0);
          }
          std::function<void_(UdpSocket_*)>::operator()(&this->m_fSllInitDone,local_318);
        }
      }
LAB_0011d9e2:
      bVar2 = false;
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&nOutDataSize);
    if (bVar2) goto LAB_0011dfe4;
  }
  Buffer._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ = -1;
  if (lock1._12_4_ == 1) {
    std::make_unique<unsigned_char[]>((size_t)&stack0xfffffffffffffe20);
    len_1._4_4_ = 0;
    pSVar4 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        &stack0xfffffffffffffe20,0);
    tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         OpenSSLWrapper::SslConnection::SslRead(pSVar4,puVar6,0xffff,(int *)((long)&len_1 + 4));
    while ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
           tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
           .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0) {
      std::make_unique<unsigned_char[]>((size_t)&stack0xfffffffffffffe08);
      puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          &stack0xfffffffffffffe20,0);
      __n = tmp;
      __result = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            &stack0xfffffffffffffe08,0);
      std::copy_n<unsigned_char*,unsigned_long,unsigned_char*>
                (puVar6,(unsigned_long)
                        __n._M_t.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,__result);
      std::mutex::lock(&(this->super_UdpSocketImpl).m_mxInDeque);
      std::
      deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
      ::
      emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&,std::__cxx11::string_const&>
                ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                  *)&(this->super_UdpSocketImpl).m_quInData,
                 (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                 &stack0xfffffffffffffe08,(unsigned_long *)&tmp,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lock._8_8_);
      std::__atomic_base<unsigned_long>::operator+=
                (&(this->super_UdpSocketImpl).m_atInBytes.super___atomic_base<unsigned_long>,
                 (__int_type)
                 tmp._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      std::mutex::unlock(&(this->super_UdpSocketImpl).m_mxInDeque);
      pSVar4 = std::
               unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ::operator->(&this->m_pSslCon);
      puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          &stack0xfffffffffffffe20,0);
      tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           OpenSSLWrapper::SslConnection::SslRead(pSVar4,puVar6,0xffff,(int *)((long)&len_1 + 4));
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                 &stack0xfffffffffffffe08);
    }
    Buffer._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ = 1;
    lock1_1._15_1_ = 0;
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)&nOutDataSize_1,&this->m_mxEnDecode);
    pSVar4 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    temp_1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         OpenSSLWrapper::SslConnection::SslGetOutDataSize(pSVar4);
    while ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
           temp_1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
           _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0) {
      std::make_unique<unsigned_char[]>((size_t)&anz);
      pSVar4 = std::
               unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ::operator->(&this->m_pSslCon);
      puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&anz
                          ,0);
      local_228 = OpenSSLWrapper::SslConnection::SslGetOutData
                            (pSVar4,puVar6,
                             (size_t)temp_1._M_t.
                                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                     .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      if (local_228 != 0) {
        std::mutex::lock(&(this->super_UdpSocketImpl).m_mxOutDeque);
        std::__atomic_base<unsigned_long>::operator+=
                  (&(this->super_UdpSocketImpl).m_atOutBytes.super___atomic_base<unsigned_long>,
                   local_228);
        std::
        deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
        ::
        emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long_const&,std::__cxx11::string_const&>
                  ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                    *)&(this->super_UdpSocketImpl).m_quOutData,
                   (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&anz,
                   &local_228,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lock._8_8_);
        std::mutex::unlock(&(this->super_UdpSocketImpl).m_mxOutDeque);
        lock1_1._15_1_ = 1;
      }
      pSVar4 = std::
               unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ::operator->(&this->m_pSslCon);
      temp_1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           OpenSSLWrapper::SslConnection::SslGetOutDataSize(pSVar4);
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&anz);
    }
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&nOutDataSize_1);
    if ((lock1_1._15_1_ & 1) == 1) {
      UdpSocketImpl::TriggerWriteThread(&this->super_UdpSocketImpl);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&nOutDataSize_1);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
               &stack0xfffffffffffffe20);
  }
  if ((sVar5 == 0) || (sVar5 == nAnzahl)) {
    this_local._4_4_ =
         Buffer._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
         _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_;
  }
  else {
    pSVar7 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator*(&this->m_pSslCon);
    pSVar8 = OpenSSLWrapper::SslConnection::operator()(pSVar7);
    std::__cxx11::to_wstring(&local_288,(unsigned_long)pSVar8);
    std::operator+(&local_268,L"SslPutInData konnte nicht alles fassen on ssl context: ",&local_288)
    ;
    std::operator+(&local_248,&local_268,L"\r\n");
    pwVar9 = (wchar_t *)std::__cxx11::wstring::c_str();
    OutputDebugString(pwVar9);
    std::__cxx11::wstring::~wstring((wstring *)&local_248);
    std::__cxx11::wstring::~wstring((wstring *)&local_268);
    std::__cxx11::wstring::~wstring((wstring *)&local_288);
    this_local._4_4_ = DatenDecode(this,buffer + sVar5,nAnzahl - sVar5,(string *)lock._8_8_);
  }
LAB_0011dfe4:
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&nPut);
  return this_local._4_4_;
}

Assistant:

int SslUdpSocketImpl::DatenDecode(const uint8_t* buffer, size_t nAnzahl, const string& strAddress)
{
    if (buffer == nullptr || nAnzahl == 0)
        return 0;

    unique_lock<mutex> lock(m_mxEnDecode);
    const size_t nPut = m_pSslCon->SslPutInData(buffer, nAnzahl);
    lock.unlock();

    if (m_bCloseReq == true)
        return -1;

    if (m_pSslCon->SSLGetShutdown() >= SSL_RECEIVED_SHUTDOWN)
    {
        m_pSslCon->ShutDownConnection();
        Close();
        return -1;
    }

    int iSslInit = m_pSslCon->SslInitFinished();
    if (iSslInit == 0)
    {
        iSslInit = m_pSslCon->SSLDoHandshake();

        bool bNewData = false;
        unique_lock<mutex> lock1(m_mxEnDecode);
        // Get the out Que of the openssl bio, the buffer is already encrypted
        size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
        while (nOutDataSize > 0)
        {
            auto temp = make_unique<uint8_t[]>(nOutDataSize);
            const size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
            // Schreibt Daten in die SOCKET
            if (len > 0)
            {
                m_mxOutDeque.lock();
                m_atOutBytes += len;
                m_quOutData.emplace_back(move(temp), len, strAddress);
                m_mxOutDeque.unlock();
                bNewData = true;
            }
            nOutDataSize = m_pSslCon->SslGetOutDataSize();
        }
        lock1.unlock();

        if (bNewData == true)
            TriggerWriteThread();

        if (iSslInit <= 0)
        {
            const int iError = m_pSslCon->SSLGetError(iSslInit);
            if (iError != SSL_ERROR_WANT_READ)
            {
                m_iError = 0x80000000 | iError;
                m_iErrLoc = 14;
                OutputDebugString(wstring(L"SSL_error: " + to_wstring(iError) + L", after SSL_do_handshake returned: " + to_wstring(iSslInit) + L" on ssl context: " + to_wstring(reinterpret_cast<size_t>((*m_pSslCon)()))).c_str());
                OutputDebugStringA(string(", msg: " + m_pSslCon->GetSslErrAsString()).c_str());
                if (m_fErrorParam && m_bStop == false)
                    m_fErrorParam(m_pBkRef, m_pvUserData);
                else if (m_fError && m_bStop == false)
                    m_fError(m_pBkRef);
                return -1;
            }
        }
        else
        {
            if (m_fSllInitDoneParam != nullptr)
                m_fSllInitDoneParam(dynamic_cast<UdpSocket*>(m_pBkRef), m_pvUserData);
            else if (m_fSllInitDone != nullptr)
                m_fSllInitDone(dynamic_cast<UdpSocket*>(m_pBkRef));
        }
    }

    int iReturn = -1;
    if (iSslInit == 1)
    {
        auto Buffer = make_unique<uint8_t[]>(0x0000ffff);
        int iErrorHint = 0;
        size_t len = m_pSslCon->SslRead(&Buffer[0], 0x0000ffff, &iErrorHint); // get receive data from the SSL layer, and put it into the unencrypted receive Que
        while (len > 0)
        {
            auto tmp = make_unique<uint8_t[]>(len);
            copy_n(&Buffer[0], len, &tmp[0]);
            m_mxInDeque.lock();
            m_quInData.emplace_back(move(tmp), len, strAddress);
            m_atInBytes += len;
            m_mxInDeque.unlock();

            len = m_pSslCon->SslRead(&Buffer[0], 0x0000ffff, &iErrorHint); // get receive data from the SSL layer, and put it into the unencrypted receive Que
        }
        iReturn = 1;

        bool bNewData = false;
        unique_lock<mutex> lock1(m_mxEnDecode);
        // Get the out Que of the openssl bio, the buffer is already encrypted
        size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
        while (nOutDataSize > 0)
        {
            auto temp = make_unique<uint8_t[]>(nOutDataSize);
            const size_t anz = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
            // Schreibt Daten in die SOCKET
            if (anz > 0)
            {
                m_mxOutDeque.lock();
                m_atOutBytes += anz;
                m_quOutData.emplace_back(move(temp), anz, strAddress);
                m_mxOutDeque.unlock();
                bNewData = true;
            }
            nOutDataSize = m_pSslCon->SslGetOutDataSize();
        }
        lock1.unlock();

        if (bNewData == true)
            TriggerWriteThread();
    }

    if (nPut != 0 && nPut != nAnzahl)
    {
        OutputDebugString(wstring(L"SslPutInData konnte nicht alles fassen on ssl context: " + to_wstring(reinterpret_cast<size_t>((*m_pSslCon)())) + L"\r\n").c_str());
        return DatenDecode(&buffer[nPut], nAnzahl - nPut, strAddress);
    }

    return iReturn;
}